

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O0

void interfaces_tests::findBlock_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  findBlock t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff158;
  std_string *in_stack_fffffffffffff160;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff168;
  findBlock *in_stack_fffffffffffff178;
  const_string *in_stack_fffffffffffff180;
  size_t in_stack_fffffffffffff188;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff190;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff198;
  undefined1 local_cb0 [408];
  undefined1 local_b18 [408];
  undefined1 local_980 [408];
  undefined1 local_7e8 [408];
  findBlock local_650;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [10])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  findBlock::findBlock(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_7e8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [10])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [16])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::setup_conditional<interfaces_tests::findBlock>((findBlock *)0x6bce1e);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_980,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [10])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  findBlock::test_method(&local_650);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_b18,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [10])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [19])in_stack_fffffffffffff160);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::teardown_conditional<interfaces_tests::findBlock>((findBlock *)0x6bd068);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  __s = local_cb0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  msg = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [10])in_stack_fffffffffffff160);
  this_00 = boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  findBlock::~findBlock((findBlock *)in_stack_fffffffffffff158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findBlock)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();

    uint256 hash;
    BOOST_CHECK(chain->findBlock(active[10]->GetBlockHash(), FoundBlock().hash(hash)));
    BOOST_CHECK_EQUAL(hash, active[10]->GetBlockHash());

    int height = -1;
    BOOST_CHECK(chain->findBlock(active[20]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, active[20]->nHeight);

    CBlock data;
    BOOST_CHECK(chain->findBlock(active[30]->GetBlockHash(), FoundBlock().data(data)));
    BOOST_CHECK_EQUAL(data.GetHash(), active[30]->GetBlockHash());

    int64_t time = -1;
    BOOST_CHECK(chain->findBlock(active[40]->GetBlockHash(), FoundBlock().time(time)));
    BOOST_CHECK_EQUAL(time, active[40]->GetBlockTime());

    int64_t max_time = -1;
    BOOST_CHECK(chain->findBlock(active[50]->GetBlockHash(), FoundBlock().maxTime(max_time)));
    BOOST_CHECK_EQUAL(max_time, active[50]->GetBlockTimeMax());

    int64_t mtp_time = -1;
    BOOST_CHECK(chain->findBlock(active[60]->GetBlockHash(), FoundBlock().mtpTime(mtp_time)));
    BOOST_CHECK_EQUAL(mtp_time, active[60]->GetMedianTimePast());

    bool cur_active{false}, next_active{false};
    uint256 next_hash;
    BOOST_CHECK_EQUAL(active.Height(), 100);
    BOOST_CHECK(chain->findBlock(active[99]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active).hash(next_hash))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(next_active);
    BOOST_CHECK_EQUAL(next_hash, active[100]->GetBlockHash());
    cur_active = next_active = false;
    BOOST_CHECK(chain->findBlock(active[100]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(!next_active);

    BOOST_CHECK(!chain->findBlock({}, FoundBlock()));
}